

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O3

gzFile gz_open(void *path,int fd,char *mode)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  gz_state *state;
  size_t sVar4;
  char *__s;
  __off64_t _Var5;
  int iVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  byte *pbVar10;
  
  if (path == (void *)0x0) {
    return (gzFile)0x0;
  }
  state = (gz_state *)aligned_alloc(0x40,0x100);
  if (state == (gz_state *)0x0) {
    return (gzFile)0x0;
  }
  state->size = 0;
  state->want = 0x20000;
  state->msg = (char *)0x0;
  bVar8 = *mode;
  if (bVar8 != 0) {
    pbVar10 = (byte *)(mode + 1);
    uVar3 = 0xffffffff;
    bVar2 = 0;
    bVar1 = 0;
    iVar7 = 0;
    iVar6 = 0;
    iVar9 = 0;
    do {
      if ((byte)(bVar8 - 0x30) < 10) {
        uVar3 = (uint)(byte)(bVar8 - 0x30);
      }
      else if (bVar8 < 0x61) {
        if (bVar8 < 0x52) {
          if (bVar8 == 0x46) {
            iVar7 = 4;
          }
          else if (bVar8 == 0x2b) goto LAB_0011a141;
        }
        else if (bVar8 == 0x52) {
          iVar7 = 3;
        }
        else if (bVar8 == 0x54) {
          iVar6 = 1;
        }
      }
      else if (bVar8 < 0x72) {
        switch(bVar8) {
        case 0x61:
          iVar9 = 1;
          break;
        case 0x65:
          bVar1 = 1;
          break;
        case 0x66:
          iVar7 = 1;
          break;
        case 0x68:
          iVar7 = 2;
        }
      }
      else if (bVar8 == 0x78) {
        bVar2 = 1;
      }
      else if (bVar8 == 0x77) {
        iVar9 = 0x79b1;
      }
      else if (bVar8 == 0x72) {
        iVar9 = 0x1c4f;
      }
      bVar8 = *pbVar10;
      pbVar10 = pbVar10 + 1;
    } while (bVar8 != 0);
    state->strategy = iVar7;
    state->direct = iVar6;
    state->mode = iVar9;
    state->level = uVar3;
    if (iVar9 == 0x1c4f) {
      if (iVar6 != 0) goto LAB_0011a141;
      state->direct = 1;
    }
    else if (iVar9 == 0) goto LAB_0011a141;
    sVar4 = strlen((char *)path);
    __s = (char *)malloc(sVar4 + 1);
    state->path = __s;
    if (__s != (char *)0x0) {
      snprintf(__s,sVar4 + 1,"%s",path);
      if (fd < 0) {
        uVar3 = (uint)(iVar9 != 0x79b1) * 0x200 + 0x200 + ((uint)bVar2 << 7 | 0x41);
        if (iVar9 == 0x1c4f) {
          uVar3 = 0;
        }
        fd = open((char *)path,uVar3 | (uint)bVar1 << 0x13,0x1b6);
        state->fd = fd;
        if (fd == -1) {
          free(__s);
          goto LAB_0011a141;
        }
      }
      else {
        state->fd = fd;
      }
      if (iVar9 == 1) {
        lseek64(fd,0,2);
        state->mode = 0x79b1;
      }
      else if (iVar9 == 0x1c4f) {
        _Var5 = lseek64(fd,0,1);
        if (_Var5 == -1) {
          _Var5 = 0;
        }
        state->start = _Var5;
      }
      gz_reset(state);
      return &state->x;
    }
  }
LAB_0011a141:
  free(state);
  return (gzFile)0x0;
}

Assistant:

static gzFile gz_open(const void *path, int fd, const char *mode) {
    gz_state *state;
    size_t len;
    int oflag;
#ifdef O_CLOEXEC
    int cloexec = 0;
#endif
#ifdef O_EXCL
    int exclusive = 0;
#endif

    /* check input */
    if (path == NULL)
        return NULL;

    /* allocate gzFile structure to return */
    state = (gz_state *)zng_alloc(sizeof(gz_state));
    if (state == NULL)
        return NULL;
    state->size = 0;            /* no buffers allocated yet */
    state->want = GZBUFSIZE;    /* requested buffer size */
    state->msg = NULL;          /* no error message yet */

    /* interpret mode */
    state->mode = GZ_NONE;
    state->level = Z_DEFAULT_COMPRESSION;
    state->strategy = Z_DEFAULT_STRATEGY;
    state->direct = 0;
    while (*mode) {
        if (*mode >= '0' && *mode <= '9') {
            state->level = *mode - '0';
        } else {
            switch (*mode) {
            case 'r':
                state->mode = GZ_READ;
                break;
#ifndef NO_GZCOMPRESS
            case 'w':
                state->mode = GZ_WRITE;
                break;
            case 'a':
                state->mode = GZ_APPEND;
                break;
#endif
            case '+':       /* can't read and write at the same time */
                zng_free(state);
                return NULL;
            case 'b':       /* ignore -- will request binary anyway */
                break;
#ifdef O_CLOEXEC
            case 'e':
                cloexec = 1;
                break;
#endif
#ifdef O_EXCL
            case 'x':
                exclusive = 1;
                break;
#endif
            case 'f':
                state->strategy = Z_FILTERED;
                break;
            case 'h':
                state->strategy = Z_HUFFMAN_ONLY;
                break;
            case 'R':
                state->strategy = Z_RLE;
                break;
            case 'F':
                state->strategy = Z_FIXED;
                break;
            case 'T':
                state->direct = 1;
                break;
            default:        /* could consider as an error, but just ignore */
                {}
            }
        }
        mode++;
    }

    /* must provide an "r", "w", or "a" */
    if (state->mode == GZ_NONE) {
        zng_free(state);
        return NULL;
    }

    /* can't force transparent read */
    if (state->mode == GZ_READ) {
        if (state->direct) {
            zng_free(state);
            return NULL;
        }
        state->direct = 1;      /* for empty file */
    }

    /* save the path name for error messages */
#ifdef WIDECHAR
    if (fd == -2) {
        len = wcstombs(NULL, (const wchar_t *)path, 0);
        if (len == (size_t)-1)
            len = 0;
    } else
#endif
        len = strlen((const char *)path);
    state->path = (char *)malloc(len + 1);
    if (state->path == NULL) {
        zng_free(state);
        return NULL;
    }
#ifdef WIDECHAR
    if (fd == -2)
        if (len) {
            wcstombs(state->path, (const wchar_t *)path, len + 1);
        } else {
            *(state->path) = 0;
        }
    else
#endif
        (void)snprintf(state->path, len + 1, "%s", (const char *)path);

    /* compute the flags for open() */
    oflag =
#ifdef O_LARGEFILE
        O_LARGEFILE |
#endif
#ifdef O_BINARY
        O_BINARY |
#endif
#ifdef O_CLOEXEC
        (cloexec ? O_CLOEXEC : 0) |
#endif
        (state->mode == GZ_READ ?
         O_RDONLY :
         (O_WRONLY | O_CREAT |
#ifdef O_EXCL
          (exclusive ? O_EXCL : 0) |
#endif
          (state->mode == GZ_WRITE ?
           O_TRUNC :
           O_APPEND)));

    /* open the file with the appropriate flags (or just use fd) */
    state->fd = fd > -1 ? fd : (
#if defined(_WIN32)
        fd == -2 ? _wopen((const wchar_t *)path, oflag, 0666) :
#elif __CYGWIN__
        fd == -2 ? open(state->path, oflag, 0666) :
#endif
        open((const char *)path, oflag, 0666));
    if (state->fd == -1) {
        free(state->path);
        zng_free(state);
        return NULL;
    }
    if (state->mode == GZ_APPEND) {
        LSEEK(state->fd, 0, SEEK_END);  /* so gzoffset() is correct */
        state->mode = GZ_WRITE;         /* simplify later checks */
    }

    /* save the current position for rewinding (only if reading) */
    if (state->mode == GZ_READ) {
        state->start = LSEEK(state->fd, 0, SEEK_CUR);
        if (state->start == -1) state->start = 0;
    }

    /* initialize stream */
    gz_reset(state);

    /* return stream */
    return (gzFile)state;
}